

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *v,MOJOSHADER_glShader *p)

{
  int iVar1;
  HashTable *table;
  MOJOSHADER_glProgram *program;
  undefined8 *key;
  void *val;
  BoundShaders shaders;
  
  if (v == (MOJOSHADER_glShader *)0x0 && p == (MOJOSHADER_glShader *)0x0) {
    MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
    return;
  }
  table = ctx->linker_cache;
  if (table == (HashTable *)0x0) {
    table = hash_create((void *)0x0,hash_shaders,match_shaders,nuke_shaders,0,ctx->malloc_fn,
                        ctx->free_fn,ctx->malloc_data);
    ctx->linker_cache = table;
    if (table == (HashTable *)0x0) {
      out_of_memory();
      return;
    }
  }
  val = (void *)0x0;
  shaders.vertex = v;
  shaders.fragment = p;
  iVar1 = hash_find(table,&shaders,&val);
  if (iVar1 == 0) {
    program = MOJOSHADER_glLinkProgram(v,p);
    if (program == (MOJOSHADER_glProgram *)0x0) {
      return;
    }
    key = (undefined8 *)Malloc(0x10);
    if (key == (undefined8 *)0x0) {
      program_unref(program);
      return;
    }
    *key = shaders.vertex;
    key[1] = shaders.fragment;
    iVar1 = hash_insert(ctx->linker_cache,key,program);
    if (iVar1 != 1) {
      (*ctx->free_fn)(key,ctx->malloc_data);
      program_unref(program);
      out_of_memory();
      return;
    }
  }
  else {
    program = (MOJOSHADER_glProgram *)val;
    if (val == (void *)0x0) {
      __assert_fail("program != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x83d,
                    "void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *, MOJOSHADER_glShader *)");
    }
  }
  MOJOSHADER_glBindProgram(program);
  return;
}

Assistant:

void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *v, MOJOSHADER_glShader *p)
{
    if ((v == NULL) && (p == NULL))
    {
        MOJOSHADER_glBindProgram(NULL);
        return;
    } // if

    // !!! FIXME: eventually support GL_EXT_separate_shader_objects.
    if (ctx->linker_cache == NULL)
    {
        ctx->linker_cache = hash_create(NULL, hash_shaders, match_shaders,
                                        nuke_shaders, 0, ctx->malloc_fn,
                                        ctx->free_fn, ctx->malloc_data);

        if (ctx->linker_cache == NULL)
        {
            out_of_memory();
            return;
        } // if
    } // if

    MOJOSHADER_glProgram *program = NULL;
    BoundShaders shaders;
    shaders.vertex = v;
    shaders.fragment = p;

    const void *val = NULL;
    if (hash_find(ctx->linker_cache, &shaders, &val))
        program = (MOJOSHADER_glProgram *) val;
    else
    {
        program = MOJOSHADER_glLinkProgram(v, p);
        if (program == NULL)
            return;

        BoundShaders *item = (BoundShaders *) Malloc(sizeof (BoundShaders));
        if (item == NULL)
        {
            MOJOSHADER_glDeleteProgram(program);
            return;
        } // if

        memcpy(item, &shaders, sizeof (BoundShaders));
        if (hash_insert(ctx->linker_cache, item, program) != 1)
        {
            Free(item);
            MOJOSHADER_glDeleteProgram(program);
            out_of_memory();
            return;
        } // if
    } // else

    assert(program != NULL);
    MOJOSHADER_glBindProgram(program);
}